

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

uint __thiscall Lodtalk::ClassTable::registerClass(ClassTable *this,Oop clazz)

{
  size_t sVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppOVar4;
  ulong __n;
  size_t elementIndex;
  size_t pageIndex;
  WriteLock<Lodtalk::SharedMutex> l;
  ClassTable *this_local;
  Oop clazz_local;
  
  l.mutex = &this->sharedMutex;
  WriteLock<Lodtalk::SharedMutex>::WriteLock
            ((WriteLock<Lodtalk::SharedMutex> *)&pageIndex,&this->sharedMutex);
  __n = this->size >> 9;
  uVar2 = this->size & 0x1ff;
  if (uVar2 == 0) {
    sVar3 = std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>::size(&this->pageTable);
    if (__n == sVar3) {
      allocatePage(this);
    }
  }
  ppOVar4 = std::vector<Lodtalk::Oop_*,_std::allocator<Lodtalk::Oop_*>_>::operator[]
                      (&this->pageTable,__n);
  (*ppOVar4)[uVar2].field_0 = clazz.field_0;
  *(ulong *)clazz.field_0 =
       *(ulong *)clazz.field_0 & 0xffffffff000003ff | (this->size & 0x3fffff) << 10;
  sVar1 = this->size;
  this->size = sVar1 + 1;
  WriteLock<Lodtalk::SharedMutex>::~WriteLock((WriteLock<Lodtalk::SharedMutex> *)&pageIndex);
  return (uint)sVar1;
}

Assistant:

unsigned int ClassTable::registerClass(Oop clazz)
{
    WriteLock<SharedMutex> l(sharedMutex);
    auto pageIndex = size / OopsPerPage;
    auto elementIndex = size % OopsPerPage;
    if(elementIndex == 0 && pageIndex == pageTable.size())
        allocatePage();

    pageTable[pageIndex][elementIndex] = clazz;
    clazz.header->identityHash = (unsigned int)size;
    return (unsigned int) (size++);
}